

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

bool __thiscall
despot::util::tinyxml::TiXmlElement::Accept(TiXmlElement *this,TiXmlVisitor *visitor)

{
  TiXmlAttribute *pTVar1;
  byte bVar2;
  undefined1 uVar3;
  int iVar4;
  TiXmlAttribute *pTVar5;
  TiXmlNode *pTVar6;
  
  pTVar1 = (this->attributeSet).sentinel.next;
  pTVar5 = (TiXmlAttribute *)0x0;
  if (pTVar1 != &(this->attributeSet).sentinel) {
    pTVar5 = pTVar1;
  }
  bVar2 = (**(code **)(*(long *)visitor + 0x20))(visitor,this,pTVar5);
  pTVar6 = (this->super_TiXmlNode).firstChild;
  if ((pTVar6 != (TiXmlNode *)0x0 & bVar2) == 1) {
    do {
      iVar4 = (*(pTVar6->super_TiXmlBase)._vptr_TiXmlBase[0x11])(pTVar6,visitor);
      if ((char)iVar4 == '\0') break;
      pTVar6 = pTVar6->next;
    } while (pTVar6 != (TiXmlNode *)0x0);
  }
  uVar3 = (**(code **)(*(long *)visitor + 0x28))(visitor,this);
  return (bool)uVar3;
}

Assistant:

bool TiXmlElement::Accept(TiXmlVisitor* visitor) const {
	if (visitor->VisitEnter(*this, attributeSet.First())) {
		for (const TiXmlNode* node = FirstChild(); node;
			node = node->NextSibling()) {
			if (!node->Accept(visitor))
				break;
		}
	}
	return visitor->VisitExit(*this);
}